

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::msgpack::basic_msgpack_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>
::basic_msgpack_cursor<std::__cxx11::istringstream&>
          (basic_msgpack_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          ,basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          error_code *ec)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  basic_msgpack_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *in_RDI;
  msgpack_decode_options *this_00;
  undefined1 local_38 [30];
  msgpack_decode_options local_1a;
  
  this_00 = &local_1a;
  local_1a._2_8_ = in_RDX;
  local_1a._10_8_ = in_RSI;
  std::allocator<char>::allocator();
  msgpack_decode_options::msgpack_decode_options(this_00);
  basic_msgpack_cursor<std::__cxx11::istringstream&>
            (in_RDI,this_00,local_1a._10_8_,local_38,local_1a._2_8_);
  msgpack_decode_options::~msgpack_decode_options(this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  return;
}

Assistant:

basic_msgpack_cursor(Sourceable&& source, std::error_code& ec)
       : basic_msgpack_cursor(std::allocator_arg, Allocator(),
             std::forward<Sourceable>(source), 
             msgpack_decode_options(), 
             ec)
    {
    }